

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O0

REF_STATUS
ref_metric_interpolate_between(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_INT new_node)

{
  REF_MPI pRVar1;
  REF_INTERP ref_interp_00;
  REF_NODE ref_node;
  uint uVar2;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_raise;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT nodes [27];
  int local_170;
  int local_16c;
  REF_INT im;
  REF_INT ibary;
  REF_DBL bary [4];
  REF_DBL log_m [6];
  REF_DBL log_parent_m [4] [6];
  REF_NODE to_node;
  REF_CELL from_cell;
  REF_NODE from_node;
  REF_GRID from_grid;
  REF_INTERP ref_interp;
  REF_MPI ref_mpi;
  REF_INT new_node_local;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_GRID ref_grid_local;
  
  pRVar1 = ref_grid->mpi;
  if (ref_grid->interp == (REF_INTERP)0x0) {
    ref_grid_local._4_4_ = 0;
  }
  else {
    ref_interp_00 = ref_grid->interp;
    ref_node = ref_interp_00->from_grid->node;
    if (ref_interp_00->from_grid->twod == 0) {
      to_node = (REF_NODE)ref_interp_00->from_tet;
    }
    else {
      to_node = (REF_NODE)ref_interp_00->from_tri;
    }
    if ((new_node < ref_interp_00->max) ||
       (ref_grid_local._4_4_ = ref_interp_resize(ref_interp_00,ref_interp_00->to_grid->node->max),
       ref_grid_local._4_4_ == 0)) {
      if (ref_interp_00->continuously == 0) {
        ref_interp_00->cell[new_node] = -1;
        ref_grid_local._4_4_ = 0;
      }
      else {
        ref_grid_local._4_4_ = ref_interp_locate_between(ref_interp_00,node0,node1,new_node);
        if (ref_grid_local._4_4_ == 0) {
          if ((ref_interp_00->cell[new_node] == -1) || (pRVar1->id != ref_interp_00->part[new_node])
             ) {
            ref_grid_local._4_4_ = 0;
          }
          else {
            ref_grid_local._4_4_ =
                 ref_cell_nodes((REF_CELL)to_node,ref_interp_00->cell[new_node],
                                &ref_private_macro_code_raise);
            if (ref_grid_local._4_4_ == 0) {
              ref_grid_local._4_4_ =
                   ref_node_clip_bary4(ref_interp_00->bary + (new_node << 2),(REF_DBL *)&im);
              if (ref_grid_local._4_4_ == 0) {
                for (local_16c = 0; local_16c < *(int *)&to_node->field_0xc;
                    local_16c = local_16c + 1) {
                  uVar2 = ref_node_metric_get_log
                                    (ref_node,(&ref_private_macro_code_raise)[local_16c],
                                     log_parent_m[(long)local_16c + -1] + 5);
                  if (uVar2 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                           ,0x23a,"ref_metric_interpolate_between",(ulong)uVar2,"log(parentM)");
                    return uVar2;
                  }
                }
                for (local_170 = 0; local_170 < 6; local_170 = local_170 + 1) {
                  bary[(long)local_170 + 3] = 0.0;
                }
                for (local_170 = 0; local_170 < 6; local_170 = local_170 + 1) {
                  for (local_16c = 0; local_16c < *(int *)&to_node->field_0xc;
                      local_16c = local_16c + 1) {
                    bary[(long)local_170 + 3] =
                         *(double *)(&im + (long)local_16c * 2) *
                         log_parent_m[(long)local_16c + -1][(long)local_170 + 5] +
                         bary[(long)local_170 + 3];
                  }
                }
                ref_grid_local._4_4_ = ref_node_metric_set_log(ref_grid->node,new_node,bary + 3);
                if (ref_grid_local._4_4_ == 0) {
                  ref_grid_local._4_4_ = 0;
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                         ,0x242,"ref_metric_interpolate_between",(ulong)ref_grid_local._4_4_,
                         "set interp log met");
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0x236,"ref_metric_interpolate_between",(ulong)ref_grid_local._4_4_,"clip");
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                     ,0x234,"ref_metric_interpolate_between",(ulong)ref_grid_local._4_4_,
                     "new_node needs to be localized");
            }
          }
        }
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0x224,"ref_metric_interpolate_between",(ulong)ref_grid_local._4_4_,"resize");
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_metric_interpolate_between(REF_GRID ref_grid,
                                                  REF_INT node0, REF_INT node1,
                                                  REF_INT new_node) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_INTERP ref_interp;
  REF_GRID from_grid;
  REF_NODE from_node;
  REF_CELL from_cell;
  REF_NODE to_node;
  REF_DBL log_parent_m[4][6], log_m[6], bary[4];
  REF_INT ibary, im;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];

  /* skip null interp */
  if (NULL == ref_grid_interp(ref_grid)) return REF_SUCCESS;
  ref_interp = ref_grid_interp(ref_grid);
  from_grid = ref_interp_from_grid(ref_interp);
  from_node = ref_grid_node(from_grid);
  from_node = ref_grid_node(from_grid);
  if (ref_grid_twod(from_grid)) {
    from_cell = ref_interp_from_tri(ref_interp);
  } else {
    from_cell = ref_interp_from_tet(ref_interp);
  }
  to_node = ref_grid_node(ref_interp_to_grid(ref_interp));

  if (new_node >= ref_interp_max(ref_interp)) {
    RSS(ref_interp_resize(ref_interp, ref_node_max(to_node)), "resize");
  }

  if (!ref_interp_continuously(ref_interp)) {
    ref_interp->cell[new_node] = REF_EMPTY; /* initialize new_node locate */
    return REF_SUCCESS;
  }

  RAISE(ref_interp_locate_between(ref_interp, node0, node1, new_node));

  /* location unsuccessful or off-part don't interpolate */
  if (REF_EMPTY == ref_interp_cell(ref_interp, new_node) ||
      ref_mpi_rank(ref_mpi) != ref_interp_part(ref_interp, new_node))
    return REF_SUCCESS;

  RSS(ref_cell_nodes(from_cell, ref_interp_cell(ref_interp, new_node), nodes),
      "new_node needs to be localized");
  RSS(ref_node_clip_bary4(&ref_interp_bary(ref_interp, 0, new_node), bary),
      "clip");

  for (ibary = 0; ibary < ref_cell_node_per(from_cell); ibary++)
    RSS(ref_node_metric_get_log(from_node, nodes[ibary], log_parent_m[ibary]),
        "log(parentM)");
  for (im = 0; im < 6; im++) log_m[im] = 0.0;
  for (im = 0; im < 6; im++) {
    for (ibary = 0; ibary < ref_cell_node_per(from_cell); ibary++) {
      log_m[im] += bary[ibary] * log_parent_m[ibary][im];
    }
  }
  RSS(ref_node_metric_set_log(ref_grid_node(ref_grid), new_node, log_m),
      "set interp log met");

  return REF_SUCCESS;
}